

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode ** Cudd_bddConstrainDecomp(DdManager *dd,DdNode *f)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  int iVar4;
  DdNode **decomp;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = dd->size;
  decomp = (DdNode **)malloc((long)(int)uVar2 * 8);
  if (decomp == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar5 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      decomp[uVar5] = (DdNode *)0x0;
    }
    do {
      dd->reordered = 0;
      for (lVar7 = 0; lVar7 < dd->size; lVar7 = lVar7 + 1) {
        if (decomp[lVar7] != (DdNode *)0x0) {
          Cudd_IterDerefBdd(dd,decomp[lVar7]);
          decomp[lVar7] = (DdNode *)0x0;
        }
      }
      iVar4 = cuddBddConstrainDecomp(dd,f,decomp);
    } while (dd->reordered == 1);
    if (iVar4 != 0) {
      uVar5 = 0;
      uVar6 = (ulong)(uint)dd->size;
      if (dd->size < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (decomp[uVar5] == (DdNode *)0x0) {
          pDVar3 = dd->one;
          decomp[uVar5] = pDVar3;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      return decomp;
    }
    free(decomp);
  }
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddConstrainDecomp(
  DdManager * dd,
  DdNode * f)
{
    DdNode **decomp;
    int res;
    int i;

    /* Create an initialize decomposition array. */
    decomp = ABC_ALLOC(DdNode *,dd->size);
    if (decomp == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) {
        decomp[i] = NULL;
    }
    do {
        dd->reordered = 0;
        /* Clean up the decomposition array in case reordering took place. */
        for (i = 0; i < dd->size; i++) {
            if (decomp[i] != NULL) {
                Cudd_IterDerefBdd(dd, decomp[i]);
                decomp[i] = NULL;
            }
        }
        res = cuddBddConstrainDecomp(dd,f,decomp);
    } while (dd->reordered == 1);
    if (res == 0) {
        ABC_FREE(decomp);
        return(NULL);
    }
    /* Missing components are constant ones. */
    for (i = 0; i < dd->size; i++) {
        if (decomp[i] == NULL) {
            decomp[i] = DD_ONE(dd);
            cuddRef(decomp[i]);
        }
    }
    return(decomp);

}